

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O0

Aig_Obj_t * createConstrained0LiveConeWithDSC(Aig_Man_t *pNewAig,Vec_Ptr_t *signalList)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int local_44;
  int numSigAntecedent;
  int i;
  Aig_Obj_t *pObj;
  Aig_Obj_t *p0LiveCone;
  Aig_Obj_t *pAntecedent;
  Aig_Obj_t *pConsequentCopy;
  Aig_Obj_t *pConsequent;
  Vec_Ptr_t *signalList_local;
  Aig_Man_t *pNewAig_local;
  
  iVar1 = Vec_PtrSize(signalList);
  p0LiveCone = Aig_ManConst1(pNewAig);
  pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(signalList,iVar1 + -1);
  pAVar4 = Aig_Regular(pAVar3);
  pAVar4 = (Aig_Obj_t *)(pAVar4->field_5).pData;
  iVar2 = Aig_IsComplement(pAVar3);
  pAVar4 = Aig_NotCond(pAVar4,iVar2);
  local_44 = 0;
  while( true ) {
    if (iVar1 + -1 <= local_44) {
      pAVar3 = Aig_Not(p0LiveCone);
      pAVar4 = Aig_Or(pNewAig,pAVar3,pAVar4);
      return pAVar4;
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(signalList,local_44);
    pAVar5 = Aig_Regular(pAVar3);
    if ((pAVar5->field_5).pData == (void *)0x0) break;
    pAVar5 = Aig_Regular(pAVar3);
    pAVar5 = (Aig_Obj_t *)(pAVar5->field_5).pData;
    iVar2 = Aig_IsComplement(pAVar3);
    pAVar3 = Aig_NotCond(pAVar5,iVar2);
    p0LiveCone = Aig_And(pNewAig,p0LiveCone,pAVar3);
    local_44 = local_44 + 1;
  }
  __assert_fail("Aig_Regular(pObj)->pData",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                ,0xe2,"Aig_Obj_t *createConstrained0LiveConeWithDSC(Aig_Man_t *, Vec_Ptr_t *)");
}

Assistant:

Aig_Obj_t *createConstrained0LiveConeWithDSC( Aig_Man_t *pNewAig, Vec_Ptr_t *signalList )
{
	Aig_Obj_t *pConsequent, *pConsequentCopy, *pAntecedent, *p0LiveCone, *pObj;
	int i, numSigAntecedent;
	
	numSigAntecedent = Vec_PtrSize( signalList ) - 1;

	pAntecedent = Aig_ManConst1( pNewAig );
	pConsequent = (Aig_Obj_t *)Vec_PtrEntry( signalList, numSigAntecedent );
	pConsequentCopy = Aig_NotCond( (Aig_Obj_t *)(Aig_Regular(pConsequent)->pData), Aig_IsComplement( pConsequent ) );

	for(i=0; i<numSigAntecedent; i++ )
	{
		pObj = (Aig_Obj_t *)Vec_PtrEntry( signalList, i );
		assert( Aig_Regular(pObj)->pData );
		pAntecedent = Aig_And( pNewAig, pAntecedent, Aig_NotCond((Aig_Obj_t *)(Aig_Regular(pObj)->pData), Aig_IsComplement(pObj)) );
	}

	p0LiveCone = Aig_Or( pNewAig, Aig_Not(pAntecedent), pConsequentCopy );

	return p0LiveCone;
}